

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimSeq.c
# Opt level: O0

int Raig_ManSimulate(Aig_Man_t *pAig,int nWords,int nIters,int TimeLimit,int fMiter,int fVerbose)

{
  undefined8 uVar1;
  int iVar2;
  uint iOut_00;
  abctime aVar3;
  Abc_Cex_t *pAVar4;
  undefined1 auStack_8c [4];
  int iOut;
  int local_84;
  int iStack_80;
  int local_7c;
  int iStack_78;
  uint local_74;
  abctime local_70;
  abctime clkTotal;
  abctime clk;
  int RetValue;
  int iPat;
  int i;
  Sec_MtrStatus_t Status;
  Raig_Man_t *p;
  int fVerbose_local;
  int fMiter_local;
  int TimeLimit_local;
  int nIters_local;
  int nWords_local;
  Aig_Man_t *pAig_local;
  
  clk._0_4_ = 0;
  local_70 = Abc_Clock();
  iVar2 = Aig_ManRegNum(pAig);
  if (iVar2 < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSimSeq.c"
                  ,0x1cc,"int Raig_ManSimulate(Aig_Man_t *, int, int, int, int, int)");
  }
  Sec_MiterStatus((Sec_MtrStatus_t *)auStack_8c,pAig);
  iPat = (int)auStack_8c;
  i = iOut;
  Status.nInputs = local_84;
  Status.nNodes = iStack_80;
  Status.nOutputs = local_7c;
  Status.nUnsat = iStack_78;
  uVar1 = Status._8_8_;
  Status.nSat = local_74;
  Status.nOutputs = (int)_local_7c;
  Status._8_8_ = uVar1;
  if (Status.nOutputs < 1) {
    Status.nUnsat = SUB84(_local_7c,4);
    if (Status.nUnsat == 0) {
      printf("Miter is trivially unsatisfiable.\n");
      pAig_local._4_4_ = 0;
    }
    else {
      Aig_ManRandom(1);
      Status._20_8_ = Raig_ManCreate(pAig);
      ((Raig_Man_t *)Status._20_8_)->nWords = nWords;
      for (RetValue = 0; RetValue < nIters; RetValue = RetValue + 1) {
        clkTotal = Abc_Clock();
        clk._0_4_ = Raig_ManSimulateRound
                              ((Raig_Man_t *)Status._20_8_,fMiter,(uint)(RetValue == 0),
                               (int *)((long)&clk + 4));
        if (fVerbose != 0) {
          printf("Frame %4d out of %4d and timeout %3d sec. ",(ulong)(RetValue + 1),
                 (ulong)(uint)nIters,(ulong)(uint)TimeLimit);
          aVar3 = Abc_Clock();
          printf("Time = %7.2f sec\r",((double)aVar3 + -(double)local_70) / 1000000.0);
        }
        if (0 < (int)clk) {
          iOut_00 = Raig_ManFindPo(*(Aig_Man_t **)Status._20_8_,(int)clk);
          if (pAig->pSeqModel != (Abc_Cex_t *)0x0) {
            __assert_fail("pAig->pSeqModel == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSimSeq.c"
                          ,0x1e8,"int Raig_ManSimulate(Aig_Man_t *, int, int, int, int, int)");
          }
          pAVar4 = Raig_ManGenerateCounter
                             (pAig,RetValue,iOut_00,nWords,clk._4_4_,
                              *(Vec_Int_t **)(Status._20_8_ + 0x38));
          pAig->pSeqModel = pAVar4;
          if (fVerbose != 0) {
            printf("Miter is satisfiable after simulation (output %d).\n",(ulong)iOut_00);
          }
          break;
        }
        aVar3 = Abc_Clock();
        if ((long)TimeLimit <= (aVar3 - clkTotal) / 1000000) {
          printf("No bug detected after %d frames with time limit %d seconds.\n",
                 (ulong)(RetValue + 1),(ulong)(uint)TimeLimit);
          break;
        }
      }
      if (fVerbose != 0) {
        printf("Maxcut = %8d.  AigMem = %7.2f MB.  SimMem = %7.2f MB.  ",
               ((double)(*(int *)(Status._20_8_ + 0x20) << 4) * 1.0) / 1048576.0,
               ((double)(*(int *)(Status._20_8_ + 0x70) * 4 * (nWords + 1)) * 1.0) / 1048576.0,
               (ulong)*(uint *)(Status._20_8_ + 0x70));
        Abc_Print(1,"%s =","Total time");
        aVar3 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - local_70) * 1.0) / 1000000.0);
      }
      Raig_ManDelete((Raig_Man_t *)Status._20_8_);
      pAig_local._4_4_ = (uint)(0 < (int)clk);
    }
  }
  else {
    printf("Miter is trivially satisfiable (output %d).\n",(ulong)local_74);
    pAig_local._4_4_ = 1;
  }
  return pAig_local._4_4_;
}

Assistant:

int Raig_ManSimulate( Aig_Man_t * pAig, int nWords, int nIters, int TimeLimit, int fMiter, int fVerbose )
{
    Raig_Man_t * p;
    Sec_MtrStatus_t Status;
    int i, iPat, RetValue = 0;
    abctime clk, clkTotal = Abc_Clock();
    assert( Aig_ManRegNum(pAig) > 0 );
    Status = Sec_MiterStatus( pAig );
    if ( Status.nSat > 0 )
    {
        printf( "Miter is trivially satisfiable (output %d).\n", Status.iOut );
        return 1;
    }
    if ( Status.nUndec == 0 )
    {
        printf( "Miter is trivially unsatisfiable.\n" );
        return 0;
    }
    Aig_ManRandom( 1 );
    p = Raig_ManCreate( pAig );
    p->nWords = nWords;
    // iterate through objects
    for ( i = 0; i < nIters; i++ )
    {
        clk = Abc_Clock();
        RetValue = Raig_ManSimulateRound( p, fMiter, i==0, &iPat );
        if ( fVerbose )
        {
            printf( "Frame %4d out of %4d and timeout %3d sec. ", i+1, nIters, TimeLimit );
            printf("Time = %7.2f sec\r", (1.0*Abc_Clock()-clkTotal)/CLOCKS_PER_SEC);
        }
        if ( RetValue > 0 )
        {
            int iOut = Raig_ManFindPo(p->pAig, RetValue);
            assert( pAig->pSeqModel == NULL );
            pAig->pSeqModel = Raig_ManGenerateCounter( pAig, i, iOut, nWords, iPat, p->vCis2Ids );
            if ( fVerbose )
            printf( "Miter is satisfiable after simulation (output %d).\n", iOut );
            break;
        }
        if ( (Abc_Clock() - clk)/CLOCKS_PER_SEC >= TimeLimit )
        {
            printf( "No bug detected after %d frames with time limit %d seconds.\n", i+1, TimeLimit );
            break;
        }
    }
    if ( fVerbose )
    {
        printf( "Maxcut = %8d.  AigMem = %7.2f MB.  SimMem = %7.2f MB.  ", 
            p->nMemsMax, 
            1.0*(p->nObjs * 16)/(1<<20), 
            1.0*(p->nMemsMax * 4 * (nWords+1))/(1<<20) );
        ABC_PRT( "Total time", Abc_Clock() - clkTotal );
    }
    Raig_ManDelete( p );
    return RetValue > 0;
}